

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItemEx(char *label,char *icon,char *shortcut,bool selected,bool enabled)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  byte in_R8B;
  ImVec2 IVar6;
  float stretch_w;
  float min_w;
  float checkmark_w;
  float shortcut_w;
  float icon_w;
  ImVec2 text_pos;
  float w;
  ImGuiMenuColumns *offsets;
  ImGuiSelectableFlags selectable_flags;
  bool pressed;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe98;
  ImVec2 *pIVar7;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  ImGuiMenuColumns *in_stack_fffffffffffffeb0;
  int iVar8;
  undefined8 in_stack_fffffffffffffeb8;
  ImVec4 *col;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float fVar9;
  ImVec2 *in_stack_fffffffffffffec8;
  float local_130;
  ImGuiStyleVar in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 uVar10;
  float in_stack_fffffffffffffee0;
  ImU32 in_stack_fffffffffffffee4;
  ImDrawList *in_stack_fffffffffffffee8;
  ImVec2 in_stack_fffffffffffffef0;
  ImVec2 local_fc;
  ImVec2 local_f4;
  undefined1 local_ec [16];
  ImVec2 local_dc;
  ImVec2 local_d4;
  undefined1 local_cc [16];
  float local_bc;
  float local_b8;
  float local_b4;
  ImVec2 local_b0;
  float local_a8;
  ImVec2 local_a4;
  float local_9c;
  ImVec2 *in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  undefined1 selected_00;
  float in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  bool local_61;
  float local_50;
  bool local_1;
  
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  selected_00 = (undefined1)((uint)in_stack_ffffffffffffff84 >> 0x18);
  pIVar5 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    IVar6 = CalcTextSize((char *)in_stack_fffffffffffffec8,
                         (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                         (float)in_stack_fffffffffffffeb8);
    bVar3 = IsRootOfOpenMenuSet();
    pIVar1 = pIVar2->NavWindow;
    if (bVar3) {
      pIVar2->NavWindow = pIVar5;
    }
    PushID((char *)in_stack_fffffffffffffeb0);
    if ((in_R8B & 1) == 0) {
      BeginDisabled(SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
    }
    if ((pIVar5->DC).LayoutType == 0) {
      local_50 = IVar6.x;
      (pIVar5->DC).CursorPos.x =
           (pIVar5->DC).CursorPos.x + (float)(int)((pIVar2->Style).ItemSpacing.x * 0.5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,
                     (pIVar5->DC).CursorPos.x + (float)(pIVar5->DC).MenuColumns.OffsetLabel,
                     (pIVar5->DC).CursorPos.y + (pIVar5->DC).CurrLineTextBaseOffset);
      iVar8 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
      fVar9 = (pIVar2->Style).ItemSpacing.x;
      pIVar7 = (ImVec2 *)&stack0xffffffffffffff7c;
      ImVec2::ImVec2(pIVar7,fVar9 + fVar9,(pIVar2->Style).ItemSpacing.y);
      uVar10 = (undefined1)((ulong)pIVar7 >> 0x38);
      PushStyleVar(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
      uVar4 = (uint)(in_CL & 1);
      pIVar7 = (ImVec2 *)&stack0xffffffffffffff74;
      ImVec2::ImVec2(pIVar7,local_50,0.0);
      local_61 = Selectable((char *)CONCAT44(local_50,in_stack_ffffffffffffff88),(bool)selected_00,
                            (ImGuiSelectableFlags)in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78);
      PopStyleVar(iVar8);
      RenderText(in_stack_fffffffffffffef0,(char *)pIVar7,
                 (char *)CONCAT44(uVar4,in_stack_fffffffffffffee0),(bool)uVar10);
      (pIVar5->DC).CursorPos.x =
           (float)(int)((pIVar2->Style).ItemSpacing.x * -0.5) + (pIVar5->DC).CursorPos.x;
    }
    else {
      if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
        local_9c = 0.0;
      }
      else {
        local_a4 = CalcTextSize((char *)in_stack_fffffffffffffec8,
                                (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ),SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                                (float)in_stack_fffffffffffffeb8);
        local_9c = local_a4.x;
      }
      if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
        local_130 = 0.0;
      }
      else {
        local_b0 = CalcTextSize((char *)in_stack_fffffffffffffec8,
                                (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ),SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                                (float)in_stack_fffffffffffffeb8);
        local_130 = local_b0.x;
      }
      local_a8 = local_130;
      local_b4 = (float)(int)(pIVar2->FontSize * 1.2);
      local_b8 = ImGuiMenuColumns::DeclColumns
                           (in_stack_fffffffffffffeb0,
                            (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                            (float)in_stack_fffffffffffffea8,
                            (float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                            (float)in_stack_fffffffffffffea0);
      iVar8 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
      local_cc._8_8_ = GetContentRegionAvail();
      fVar9 = 0.0;
      local_bc = ImMax<float>(0.0,(float)local_cc._8_4_ - local_b8);
      col = (ImVec4 *)local_cc;
      ImVec2::ImVec2((ImVec2 *)col,local_b8,fVar9);
      local_61 = Selectable((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (bool)selected_00,(ImGuiSelectableFlags)in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78);
      ImVec2::ImVec2(&local_dc,(float)(pIVar5->DC).MenuColumns.OffsetLabel,fVar9);
      local_d4 = operator+(in_stack_fffffffffffffe98,(ImVec2 *)0x194ace);
      RenderText(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                 (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),(bool)uVar10)
      ;
      if (0.0 < local_9c) {
        in_stack_fffffffffffffeb0 = (ImGuiMenuColumns *)local_ec;
        ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffeb0,
                       (float)(pIVar5->DC).MenuColumns.OffsetIcon,0.0);
        local_ec._8_8_ = operator+(in_stack_fffffffffffffe98,(ImVec2 *)0x194b3b);
        RenderText(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                   (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (bool)uVar10);
      }
      if (0.0 < local_a8) {
        PushStyleColor((ImGuiCol)fVar9,col);
        ImVec2::ImVec2(&local_fc,(float)(pIVar5->DC).MenuColumns.OffsetShortcut + local_bc,0.0);
        local_f4 = operator+(in_stack_fffffffffffffe98,(ImVec2 *)0x194bcb);
        RenderText(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                   (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (bool)uVar10);
        PopStyleColor(iVar8);
      }
      if ((in_CL & 1) != 0) {
        pIVar7 = (ImVec2 *)&stack0xfffffffffffffef4;
        ImVec2::ImVec2(pIVar7,pIVar2->FontSize * 0.4 +
                              (float)(pIVar5->DC).MenuColumns.OffsetMark + local_bc,
                       pIVar2->FontSize * 0.134 * 0.5);
        operator+(pIVar7,(ImVec2 *)0x194c8b);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                    SUB84(in_stack_fffffffffffffeb0,0));
        RenderCheckMark(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
      }
    }
    if ((in_R8B & 1) == 0) {
      EndDisabled();
    }
    PopID();
    if (bVar3) {
      pIVar2->NavWindow = pIVar1;
    }
    local_1 = local_61;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItemEx(const char* label, const char* icon, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    const bool menuset_is_open = IsRootOfOpenMenuSet();
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;

    // We've been using the equivalent of ImGuiSelectableFlags_SetNavIdOnHover on all Selectable() since early Nav system days (commit 43ee5d73),
    // but I am unsure whether this should be kept at all. For now moved it to be an opt-in feature used by menus only.
    bool pressed;
    PushID(label);
    if (!enabled)
        BeginDisabled();

    const ImGuiSelectableFlags selectable_flags = ImGuiSelectableFlags_SelectOnRelease | ImGuiSelectableFlags_SetNavIdOnHover;
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation: we don't render the shortcut, we render a highlight instead of the selected tick mark.
        float w = label_size.x;
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable("", selected, selectable_flags, ImVec2(w, 0.0f));
        PopStyleVar();
        RenderText(text_pos, label);
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu item inside a vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float shortcut_w = (shortcut && shortcut[0]) ? CalcTextSize(shortcut, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, shortcut_w, checkmark_w); // Feedback for next frame
        float stretch_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable("", false, selectable_flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(pos + ImVec2(offsets->OffsetLabel, 0.0f), label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        if (shortcut_w > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(offsets->OffsetShortcut + stretch_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(window->DrawList, pos + ImVec2(offsets->OffsetMark + stretch_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(ImGuiCol_Text), g.FontSize  * 0.866f);
    }
    IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    if (!enabled)
        EndDisabled();
    PopID();
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    return pressed;
}